

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButton::focusInEvent(QAbstractButton *this,QFocusEvent *e)

{
  QWidget *in_RDI;
  QAbstractButtonPrivate *d;
  QFocusEvent *in_stack_ffffffffffffffd8;
  
  d_func((QAbstractButton *)0x501141);
  QAbstractButtonPrivate::fixFocusPolicy(d);
  QWidget::focusInEvent(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void QAbstractButton::focusInEvent(QFocusEvent *e)
{
    Q_D(QAbstractButton);
#ifdef QT_KEYPAD_NAVIGATION
    if (!QApplicationPrivate::keypadNavigationEnabled())
#endif
    d->fixFocusPolicy();
    QWidget::focusInEvent(e);
}